

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_csv_dataset.cpp
# Opt level: O0

int main(void)

{
  pointer *ppiVar1;
  initializer_list<int> __l;
  int iVar2;
  bool bVar3;
  result_type_conflict rVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pvVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b50;
  const_iterator local_1b48;
  int *local_1b40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b38;
  const_iterator local_1b30;
  int local_1b24;
  int local_1b20;
  int counter_2;
  int counter_1;
  int counter;
  uniform_int_distribution<int> dist;
  mt19937 engine;
  duration<long,_std::ratio<1L,_1000000000L>_> local_780;
  result_type local_778;
  rep seed;
  long local_750;
  ofstream outputStreamForInsert;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  long local_530;
  ofstream outputStreamForErase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  long local_310;
  ofstream outputStreamForFind;
  allocator<int> local_109;
  int local_108 [12];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> integers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_streams;
  undefined1 local_90 [8];
  string pathToInsert;
  undefined1 local_68 [8];
  string pathToErase;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string pathToFind;
  
  pathToFind.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_30,&kDatasetPathFind,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_68,&kDatasetPathErase,
             (allocator<char> *)(pathToInsert.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pathToInsert.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_90,&kDatasetPathInsert,
             (allocator<char> *)
             ((long)&output_streams.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&output_streams.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  poVar5 = std::operator<<((ostream *)&std::cout,"Dataset pathToInsert: ");
  poVar5 = std::operator<<(poVar5,(string *)local_90);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Dataset pathToFind: ");
  poVar5 = std::operator<<(poVar5,(string *)local_30);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"Dataset pathToErase: ");
  poVar5 = std::operator<<(poVar5,(string *)local_68);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  ppiVar1 = &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)ppiVar1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppiVar1,
             (char (*) [9])"/100.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [9])"/500.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [10])"/1000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [10])"/5000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [11])"/10000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [11])"/50000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [12])"/100000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [12])"/500000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [13])"/1000000.csv");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(char (*) [13])"/5000000.csv");
  local_108[4] = 10000;
  local_108[5] = 50000;
  local_108[6] = 100000;
  local_108[7] = 500000;
  local_108[0] = 100;
  local_108[1] = 500;
  local_108[2] = 1000;
  local_108[3] = 5000;
  local_108[8] = 1000000;
  local_108[9] = 5000000;
  local_d8 = local_108;
  local_d0 = 10;
  std::allocator<int>::allocator(&local_109);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,__l,&local_109);
  std::allocator<int>::~allocator(&local_109);
  while (bVar3 = std::vector<int,_std::allocator<int>_>::empty
                           ((vector<int,_std::allocator<int>_> *)local_c8),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   pvVar6);
    std::ofstream::ofstream(&local_310,(string *)&local_330,_S_trunc);
    std::__cxx11::string::~string((string *)&local_330);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   pvVar6);
    std::ofstream::ofstream(&local_530,(string *)&local_550,_S_trunc);
    std::__cxx11::string::~string((string *)&local_550);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&seed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   pvVar6);
    std::ofstream::ofstream(&local_750,(string *)&seed,_S_trunc);
    std::__cxx11::string::~string((string *)&seed);
    engine._M_p = std::chrono::_V2::system_clock::now();
    local_780.__r =
         (rep)std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&engine._M_p);
    local_778 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_780);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&dist,local_778);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)&counter_1,0,10000000);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_310 + *(long *)(local_310 + -0x18)));
    if (bVar3) {
      for (counter_2 = 0; iVar2 = counter_2,
          pvVar7 = std::vector<int,_std::allocator<int>_>::front
                             ((vector<int,_std::allocator<int>_> *)local_c8), iVar2 < *pvVar7 + -1;
          counter_2 = counter_2 + 1) {
        rVar4 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&counter_1,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&dist);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_310,rVar4);
        std::operator<<(poVar5,',');
      }
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&counter_1,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&dist);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_310,rVar4);
      std::operator<<(poVar5,'\n');
    }
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_530 + *(long *)(local_530 + -0x18)));
    if (bVar3) {
      for (local_1b20 = 0; iVar2 = local_1b20,
          pvVar7 = std::vector<int,_std::allocator<int>_>::front
                             ((vector<int,_std::allocator<int>_> *)local_c8), iVar2 < *pvVar7 + -1;
          local_1b20 = local_1b20 + 1) {
        rVar4 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&counter_1,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&dist);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_530,rVar4);
        std::operator<<(poVar5,',');
      }
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&counter_1,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&dist);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_530,rVar4);
      std::operator<<(poVar5,'\n');
    }
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_750 + *(long *)(local_750 + -0x18)));
    if (bVar3) {
      for (local_1b24 = 0; iVar2 = local_1b24,
          pvVar7 = std::vector<int,_std::allocator<int>_>::front
                             ((vector<int,_std::allocator<int>_> *)local_c8), iVar2 < *pvVar7 + -1;
          local_1b24 = local_1b24 + 1) {
        rVar4 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)&counter_1,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&dist);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_750,rVar4);
        std::operator<<(poVar5,',');
      }
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&counter_1,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&dist);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_750,rVar4);
      std::operator<<(poVar5,'\n');
    }
    local_1b38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_c8);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1b30,
               &local_1b38);
    local_1b40 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                  ((vector<int,_std::allocator<int>_> *)local_c8,local_1b30);
    ppiVar1 = &integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_1b50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppiVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1b48,&local_1b50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)ppiVar1,local_1b48);
    std::ofstream::~ofstream(&local_750);
    std::ofstream::~ofstream(&local_530);
    std::ofstream::~ofstream(&local_310);
  }
  pathToFind.field_2._12_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&integers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return pathToFind.field_2._12_4_;
}

Assistant:

int main() {
  const auto pathToFind = string(kDatasetPathFind);
  const auto pathToErase = string(kDatasetPathErase);
  const auto pathToInsert = string(kDatasetPathInsert);
  cout << "Dataset pathToInsert: " << pathToInsert << endl;
  cout << "Dataset pathToFind: " << pathToFind << endl;
  cout << "Dataset pathToErase: " << pathToErase << endl;

  vector<string> output_streams;
  output_streams.emplace_back("/100.csv");
  output_streams.emplace_back("/500.csv");
  output_streams.emplace_back("/1000.csv");
  output_streams.emplace_back("/5000.csv");
  output_streams.emplace_back("/10000.csv");
  output_streams.emplace_back("/50000.csv");
  output_streams.emplace_back("/100000.csv");
  output_streams.emplace_back("/500000.csv");
  output_streams.emplace_back("/1000000.csv");
  output_streams.emplace_back("/5000000.csv");

  vector<int> integers = {100, 500, 1000, 5000, 10000, 50000, 100000, 500000, 1000000, 5000000};

  while (!integers.empty()) {
    auto outputStreamForFind = ofstream(pathToFind + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForErase = ofstream(pathToErase + output_streams.front(), ios::ios_base::trunc);
    auto outputStreamForInsert = ofstream(pathToInsert + output_streams.front(), ios::ios_base::trunc);

    const auto seed = chrono::system_clock::now().time_since_epoch().count();
    auto engine = mt19937(seed);  // без seed`а генератор будет выдавать одни и те же значения
    auto dist = uniform_int_distribution(0, 10000000);  // равновероятное распределение генерируемых чисел

    if (outputStreamForFind) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForFind << dist(engine) << ',';
      }
      outputStreamForFind << dist(engine) << '\n';
    }

    if (outputStreamForErase) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForErase << dist(engine) << ',';
      }
      outputStreamForErase << dist(engine) << '\n';
    }

    if (outputStreamForInsert) {
      for (int counter = 0; counter < integers.front() - 1; counter++) {
        outputStreamForInsert << dist(engine) << ',';
      }
      outputStreamForInsert << dist(engine) << '\n';
    }

    integers.erase(integers.begin());
    output_streams.erase(output_streams.begin());
  }

  return 0;
}